

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O0

Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *
LoadAddrman(NetGroupManager *netgroupman,ArgsManager *args)

{
  int iVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  int64_t iVar3;
  int *piVar4;
  pointer pAVar5;
  _Variadic_union<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> _Var6;
  type tVar7;
  size_t sVar8;
  Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *in_RDI;
  long in_FS_OFFSET;
  DbNotFoundError *anon_var_0;
  InvalidAddrManVersionError *anon_var_0_1;
  exception *e;
  time_point start;
  __single_object addrman;
  bool deterministic;
  int check_addrman;
  path path_addr;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffabc;
  ArgsManager *in_stack_fffffffffffffac0;
  char *obj;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffac8;
  Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *this;
  path *in_stack_fffffffffffffad0;
  _Optional_payload_base<Network> in_stack_fffffffffffffad8;
  int *in_stack_fffffffffffffae0;
  bool *in_stack_fffffffffffffae8;
  NetGroupManager *in_stack_fffffffffffffaf0;
  allocator<char> *in_stack_fffffffffffffaf8;
  string *in_stack_fffffffffffffb00;
  ArgsManager *in_stack_fffffffffffffb08;
  LogFlags in_stack_fffffffffffffb20;
  int in_stack_fffffffffffffb2c;
  ConstevalFormatString<2U> in_stack_fffffffffffffb68;
  Level in_stack_fffffffffffffc60;
  unsigned_long *in_stack_fffffffffffffc70;
  long *in_stack_fffffffffffffc78;
  optional<bool> local_2fa;
  undefined1 local_2f8 [64];
  undefined4 local_2b8;
  allocator<char> local_2b1;
  undefined4 local_2b0;
  int local_2ac;
  optional<Network> local_278 [78];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  iVar3 = ArgsManager::GetIntArg
                    (in_stack_fffffffffffffac0,
                     (string *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                     in_stack_fffffffffffffac8.__r);
  local_2b0 = (undefined4)iVar3;
  local_2b8._0_1_ = '\0';
  local_2b8._1_3_ = 0;
  local_2f8._60_4_ = 1000000;
  piVar4 = std::clamp<int>((int *)in_stack_fffffffffffffad8,(int *)in_stack_fffffffffffffad0,
                           (int *)in_stack_fffffffffffffac8.__r);
  iVar1 = *piVar4;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  std::allocator<char>::~allocator(&local_2b1);
  local_2ac = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  bVar2 = HasTestOption(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  std::allocator<char>::~allocator((allocator<char> *)(local_2f8 + 0x3a));
  local_2f8[0x3b] = bVar2;
  std::make_unique<AddrMan,NetGroupManager_const&,bool&,int&>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  local_2f8._40_8_ = std::chrono::_V2::steady_clock::now();
  ArgsManager::GetDataDirNet(in_stack_fffffffffffffac0);
  fs::operator/(in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8.__r);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator*
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_fffffffffffffac8.__r);
  (anonymous_namespace)::DeserializeFileDB<AddrMan&>
            ((path *)in_stack_fffffffffffffaf8,(AddrMan *)in_stack_fffffffffffffaf0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffad8,
             (char *)in_stack_fffffffffffffad0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffad8,
             (char *)in_stack_fffffffffffffad0);
  pAVar5 = std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
                     ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)
                      CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  std::optional<Network>::optional(local_278);
  std::optional<bool>::optional(&local_2fa);
  _Var6 = (_Variadic_union<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_>)
          AddrMan::Size((AddrMan *)in_stack_fffffffffffffac0,
                        (optional<Network>)in_stack_fffffffffffffad8,
                        (_Optional_base<bool,_true,_true>)
                        SUB82((ulong)in_stack_fffffffffffffac8.__r >> 0x30,0));
  local_2f8._0_8_ = _Var6;
  std::chrono::_V2::steady_clock::now();
  tVar7 = std::chrono::operator-
                    ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffac0,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
  sVar8 = Ticks<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (in_stack_fffffffffffffac8);
  this = (Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *)local_2f8;
  obj = "Loaded %i addresses from peers.dat  %dms\n";
  uVar9 = 2;
  logging_function._M_str = (char *)_Var6;
  logging_function._M_len = (size_t)pAVar5;
  source_file._M_str = (char *)tVar7.__r;
  source_file._M_len = sVar8;
  LogPrintFormatInternal<unsigned_long,long>
            (logging_function,source_file,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20,
             in_stack_fffffffffffffc60,in_stack_fffffffffffffb68,in_stack_fffffffffffffc70,
             in_stack_fffffffffffffc78);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)
             CONCAT44(in_stack_fffffffffffffabc,uVar9),
             (unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)0x870d7a);
  util::Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_>::Result(this,(T *)obj);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)this);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffabc,uVar9));
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<std::unique_ptr<AddrMan>> LoadAddrman(const NetGroupManager& netgroupman, const ArgsManager& args)
{
    auto check_addrman = std::clamp<int32_t>(args.GetIntArg("-checkaddrman", DEFAULT_ADDRMAN_CONSISTENCY_CHECKS), 0, 1000000);
    bool deterministic = HasTestOption(args, "addrman"); // use a deterministic addrman only for tests

    auto addrman{std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman)};

    const auto start{SteadyClock::now()};
    const auto path_addr{args.GetDataDirNet() / "peers.dat"};
    try {
        DeserializeFileDB(path_addr, *addrman);
        LogPrintf("Loaded %i addresses from peers.dat  %dms\n", addrman->Size(), Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
    } catch (const DbNotFoundError&) {
        // Addrman can be in an inconsistent state after failure, reset it
        addrman = std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman);
        LogPrintf("Creating peers.dat because the file was not found (%s)\n", fs::quoted(fs::PathToString(path_addr)));
        DumpPeerAddresses(args, *addrman);
    } catch (const InvalidAddrManVersionError&) {
        if (!RenameOver(path_addr, (fs::path)path_addr + ".bak")) {
            return util::Error{strprintf(_("Failed to rename invalid peers.dat file. Please move or delete it and try again."))};
        }
        // Addrman can be in an inconsistent state after failure, reset it
        addrman = std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman);
        LogPrintf("Creating new peers.dat because the file version was not compatible (%s). Original backed up to peers.dat.bak\n", fs::quoted(fs::PathToString(path_addr)));
        DumpPeerAddresses(args, *addrman);
    } catch (const std::exception& e) {
        return util::Error{strprintf(_("Invalid or corrupt peers.dat (%s). If you believe this is a bug, please report it to %s. As a workaround, you can move the file (%s) out of the way (rename, move, or delete) to have a new one created on the next start."),
                                     e.what(), PACKAGE_BUGREPORT, fs::quoted(fs::PathToString(path_addr)))};
    }
    return addrman;
}